

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
* __thiscall
phmap::priv::
btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
::erase(pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
        *__return_storage_ptr__,
       btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
       *this,iterator _begin,iterator _end)

{
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  bVar1;
  size_type sVar2;
  long lVar4;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *pbVar5;
  int iVar6;
  ulong uVar7;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *extraout_RDX;
  allocator_type *paVar8;
  allocator_type *extraout_RDX_00;
  allocator_type *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *extraout_RDX_04;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *extraout_RDX_05;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *extraout_RDX_06;
  allocator_type *extraout_RDX_07;
  slot_type *src;
  string *psVar9;
  long lVar10;
  size_type sVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  string *this_00;
  unsigned_long uVar15;
  iterator iVar16;
  iterator iter;
  iterator iter_00;
  iterator iter_01;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_70;
  btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_60;
  ulong local_50;
  btree<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *local_48;
  ulong local_40;
  unsigned_long local_38;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
  *pbVar3;
  
  pbVar5 = _end.node;
  pbVar3 = _begin.node;
  iVar6 = _begin.position;
  iVar12 = _end.position;
  uVar15 = 0;
  paVar8 = (allocator_type *)pbVar3;
  local_70.node = pbVar3;
  local_70.position = iVar6;
  if (iVar12 != iVar6 || pbVar3 != pbVar5) {
    do {
      do {
        btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
        ::operator++(&local_70);
        uVar15 = uVar15 + 1;
      } while (local_70.node != pbVar5);
      paVar8 = (allocator_type *)extraout_RDX;
    } while (local_70.position != iVar12);
  }
  iVar16._8_8_ = paVar8;
  iVar16.node = pbVar3;
  if ((long)uVar15 < 0) {
    __assert_fail("count >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                  ,0xac4,
                  "std::pair<size_type, iterator> phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>>::erase(iterator, iterator) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>]"
                 );
  }
  if (uVar15 == 0) {
    uVar15 = 0;
  }
  else {
    uVar7 = this->size_ - uVar15;
    if (uVar7 == 0) {
      if (this->size_ != 0) {
        internal_clear(this,(this->root_).
                            super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                            .
                            super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
                            .
                            super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
                            ._M_head_impl);
      }
      (this->root_).
      super__Tuple_impl<0UL,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
      .
      super__Tuple_impl<1UL,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
      .
      super__Tuple_impl<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*>
      .
      super__Head_base<2UL,_phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>_*,_false>
      ._M_head_impl =
           (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            *)&btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::__cxx11::string>,256,true>>
               ::EmptyNode()::empty_node_abi_cxx11_;
      this->rightmost_ =
           (node_type *)
           &btree<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::CompareIntToString,std::allocator<std::__cxx11::string>,256,true>>
            ::EmptyNode()::empty_node_abi_cxx11_;
      this->size_ = 0;
      iVar16 = end(this);
      pbVar3 = iVar16.node;
      iVar6 = iVar16.position;
    }
    else {
      local_48 = this;
      if (pbVar3 == pbVar5) {
        if (iVar12 - iVar6 == 0 || iVar12 < iVar6) {
          __assert_fail("_end.position > _begin.position",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0xae6,
                        "void phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>>::erase_same_node(iterator, iterator) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>]"
                       );
        }
        if (((undefined1  [16])_begin & (undefined1  [16])0x7) != (undefined1  [16])0x0) {
LAB_00199170:
          __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                        ,0xf84,
                        "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                       );
        }
        uVar7 = (ulong)(iVar12 - iVar6);
        sVar11 = (size_type)iVar6;
        local_50 = (ulong)iVar12;
        if (pbVar3[0xb] ==
            (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
             )0x0) {
          if (iVar12 != iVar6) {
            uVar13 = 0;
            do {
              pbVar5 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                       ::child(pbVar3,sVar11 + 1 + uVar13);
              internal_clear(local_48,pbVar5);
              uVar13 = uVar13 + 1;
              paVar8 = (allocator_type *)extraout_RDX_04;
            } while (uVar13 < uVar7);
          }
          uVar13 = local_50;
          sVar2 = sVar11;
          if (uVar7 + 1 + sVar11 <= (ulong)(byte)pbVar3[10]) {
            do {
              uVar13 = uVar13 + 1;
              pbVar5 = btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                       ::child(pbVar3,uVar13);
              btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::set_child(pbVar3,sVar2 + 1,pbVar5);
              btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
              ::mutable_child(pbVar3,uVar13);
              paVar8 = (allocator_type *)extraout_RDX_05;
              sVar2 = sVar2 + 1;
            } while (uVar13 < (byte)pbVar3[10]);
          }
        }
        this_00 = (string *)(pbVar3 + sVar11 * 0x20 + 0x10);
        psVar9 = (string *)
                 ((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                   *)this_00 + uVar7 * 0x20);
        local_40 = uVar7;
        if (psVar9 != (string *)(pbVar3 + (ulong)(byte)pbVar3[10] * 0x20 + 0x10)) {
          lVar4 = (ulong)(byte)pbVar3[10] * 0x20 + local_50 * -0x20;
          do {
            std::__cxx11::string::operator=(this_00,psVar9);
            psVar9 = psVar9 + 0x20;
            this_00 = this_00 + 0x20;
            lVar4 = lVar4 + -0x20;
            paVar8 = (allocator_type *)extraout_RDX_06;
          } while (lVar4 != 0);
        }
        if (iVar12 != iVar6) {
          bVar1 = pbVar3[10];
          lVar4 = sVar11 - local_50;
          do {
            btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::value_destroy(pbVar3,(ulong)(byte)bVar1 + lVar4,paVar8);
            lVar4 = lVar4 + 1;
            paVar8 = extraout_RDX_07;
          } while (lVar4 != 0);
        }
        pbVar3[10] = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                      )((char)pbVar3[10] - (char)local_40);
        local_48->size_ = local_48->size_ - uVar15;
        iter_01._12_4_ = 0;
        iter_01.node = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                        *)SUB128(_begin._0_12_,0);
        iter_01.position = SUB124(_begin._0_12_,8);
        iVar16 = rebalance_after_delete(local_48,iter_01);
        pbVar3 = iVar16.node;
        iVar6 = iVar16.position;
      }
      else {
        uVar13 = this->size_;
        local_38 = uVar15;
        while (uVar7 < uVar13) {
          pbVar3 = iVar16.node;
          if (((undefined1  [16])iVar16 & (undefined1  [16])0x7) != (undefined1  [16])0x0)
          goto LAB_00199170;
          if (pbVar3[0xb] ==
              (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
               )0x0) {
            bVar1 = pbVar3[0xb];
            local_60.position = iVar6;
            if (bVar1 == (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                          )0x0) {
              local_60.node = pbVar3;
              btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              ::operator--(&local_60);
              if (((ulong)local_60.node & 7) != 0) goto LAB_00199170;
              if (local_60.node[0xb] ==
                  (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                   )0x0) {
                __assert_fail("iter.node->leaf()",
                              "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                              ,0xa7e,
                              "iterator phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>>::erase(iterator) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>]"
                             );
              }
              std::__cxx11::string::operator=
                        ((string *)(pbVar3 + (long)iVar6 * 0x20 + 0x10),
                         (string *)(local_60.node + (long)local_60.position * 0x20 + 0x10));
              iVar16._8_8_ = extraout_RDX_02;
              iVar16.node = local_60.node;
            }
            local_60.node = iVar16.node;
            btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
            ::remove_value(local_60.node,local_60.position,iVar16._8_8_);
            this->size_ = this->size_ - 1;
            iter_00.position = local_60.position;
            iter_00.node = local_60.node;
            iter_00._12_4_ = 0;
            iVar16 = rebalance_after_delete(this,iter_00);
            local_70.node = iVar16.node;
            local_70.position = iVar16.position;
            if (bVar1 == (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                          )0x0) {
              btree_iterator<phmap::priv::btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
              ::operator++(&local_70);
              iVar16._8_8_ = extraout_RDX_03;
              iVar16.node = local_70.node;
            }
            local_70.node = iVar16.node;
            iVar6 = local_70.position;
          }
          else {
            bVar1 = pbVar3[10];
            uVar14 = uVar13 - uVar7;
            if ((ulong)(long)(int)((uint)(byte)bVar1 - iVar6) <= uVar13 - uVar7) {
              uVar14 = (long)(int)((uint)(byte)bVar1 - iVar6);
            }
            if ((int)(uint)(byte)bVar1 <= iVar6) {
              __assert_fail("node->count() > _begin.position",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb04,
                            "iterator phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>]"
                           );
            }
            lVar4 = (long)iVar6;
            if ((ulong)(byte)bVar1 < lVar4 + uVar14) {
              __assert_fail("_begin.position + to_erase <= node->count()",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0xb05,
                            "iterator phmap::priv::btree<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>>::erase_from_leaf_node(iterator, size_type) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::CompareIntToString, std::allocator<std::basic_string<char>>, 256, true>]"
                           );
            }
            psVar9 = (string *)(pbVar3 + lVar4 * 0x20 + 0x10);
            lVar10 = uVar14 * 0x20;
            paVar8 = (allocator_type *)(pbVar3 + (ulong)(byte)bVar1 * 0x20 + 0x10);
            if ((allocator_type *)(psVar9 + lVar10) != paVar8) {
              lVar4 = (ulong)(byte)bVar1 * 0x20 + lVar4 * -0x20;
              do {
                std::__cxx11::string::operator=(psVar9,psVar9 + lVar10);
                psVar9 = psVar9 + 0x20;
                lVar4 = lVar4 + -0x20;
                paVar8 = extraout_RDX_00;
              } while (lVar10 != lVar4);
            }
            if (uVar14 != 0) {
              bVar1 = pbVar3[10];
              lVar4 = -uVar14;
              do {
                btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                ::value_destroy(pbVar3,(ulong)(byte)bVar1 + lVar4,paVar8);
                lVar4 = lVar4 + 1;
                paVar8 = extraout_RDX_01;
              } while (lVar4 != 0);
            }
            this = local_48;
            pbVar3[10] = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::CompareIntToString,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_true>_>
                          )((char)pbVar3[10] - (char)uVar14);
            local_48->size_ = local_48->size_ - uVar14;
            iter.position = iVar6;
            iter.node = pbVar3;
            iter._12_4_ = 0;
            iVar16 = rebalance_after_delete(local_48,iter);
            uVar15 = local_38;
            iVar6 = iVar16.position;
          }
          pbVar3 = iVar16.node;
          uVar13 = this->size_;
        }
      }
    }
  }
  __return_storage_ptr__->first = uVar15;
  (__return_storage_ptr__->second).node = pbVar3;
  (__return_storage_ptr__->second).position = iVar6;
  return __return_storage_ptr__;
}

Assistant:

auto btree<P>::erase(iterator _begin, iterator _end)
        -> std::pair<size_type, iterator> {
        difference_type count = std::distance(_begin, _end);
        assert(count >= 0);

        if (count == 0) {
            return {0, _begin};
        }

        if (count == (difference_type)size_) {
            clear();
            return {count, this->end()};
        }

        if (_begin.node == _end.node) {
            erase_same_node(_begin, _end);
            size_ -= count;
            return {count, rebalance_after_delete(_begin)};
        }

        const size_type target_size = size_ - count;
        while (size_ > target_size) {
            if (_begin.node->leaf()) {
                const size_type remaining_to_erase = size_ - target_size;
                const size_type remaining_in_node = _begin.node->count() - _begin.position;
                _begin = erase_from_leaf_node(
                    _begin, (std::min)(remaining_to_erase, remaining_in_node));
            } else {
                _begin = erase(_begin);
            }
        }
        return {count, _begin};
    }